

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffprec(fitsfile *fptr,char *card,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  char tcard [81];
  char local_78 [80];
  undefined1 local_28;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if ((fptr->Fptr->datastart - fptr->Fptr->headend == 0x50) &&
     (iVar2 = ffiblk(fptr,1,0,status), 0 < iVar2)) {
    return *status;
  }
  strncpy(local_78,card,0x50);
  local_28 = 0;
  sVar3 = strlen(local_78);
  if (sVar3 != 0) {
    sVar5 = 0;
    do {
      if ((byte)(local_78[sVar5] + 0x81U) < 0xa1) {
        local_78[sVar5] = ' ';
      }
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  if (sVar3 < 0x50) {
    memset(local_78 + sVar3,0x20,0x50 - sVar3);
  }
  sVar3 = strcspn(local_78,"=");
  if ((int)sVar3 == 0x50) {
    sVar3 = 8;
  }
  iVar2 = fits_strncasecmp("COMMENT ",local_78,8);
  if ((((iVar2 == 0) || (iVar2 = fits_strncasecmp("HISTORY ",local_78,8), iVar2 == 0)) ||
      (iVar2 = fits_strncasecmp("        ",local_78,8), iVar2 == 0)) ||
     (iVar2 = fits_strncasecmp("CONTINUE",local_78,8), iVar2 == 0)) {
    sVar3 = 8;
  }
  if (sVar3 << 0x20 != 0) {
    lVar7 = (long)(sVar3 << 0x20) >> 0x20;
    pp_Var4 = __ctype_toupper_loc();
    lVar6 = 0;
    do {
      local_78[lVar6] = (char)(*pp_Var4)[local_78[lVar6]];
      lVar6 = lVar6 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
  }
  fftkey(local_78,status);
  ffmbyt(fptr,fptr->Fptr->headend,1,status);
  ffpbyt(fptr,0x50,local_78,status);
  iVar2 = *status;
  if (iVar2 < 1) {
    pLVar1 = &fptr->Fptr->headend;
    *pLVar1 = *pLVar1 + 0x50;
  }
  return iVar2;
}

Assistant:

int ffprec(fitsfile *fptr,     /* I - FITS file pointer        */
           const char *card,   /* I - string to be written     */
           int *status)        /* IO - error status            */
/*
  write a keyword record (80 bytes long) to the end of the header
*/
{
    char tcard[FLEN_CARD];
    size_t len, ii;
    long nblocks;
    int keylength;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* no room */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* insert 2880-byte block */
            return(*status);  
    }

    strncpy(tcard,card,80);
    tcard[80] = '\0';

    len = strlen(tcard);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (tcard[ii] < ' ' || tcard[ii] > 126) tcard[ii] = ' ';

    for (ii=len; ii < 80; ii++)    /* fill card with spaces if necessary */
        tcard[ii] = ' ';

    keylength = strcspn(tcard, "=");   /* support for free-format keywords */
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", tcard, 8) || !fits_strncasecmp( "HISTORY ", tcard, 8) ||
         !fits_strncasecmp( "        ", tcard, 8) || !fits_strncasecmp( "CONTINUE", tcard, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        tcard[ii] = toupper(tcard[ii]);

    fftkey(tcard, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(tcard, status);  */        /* test rest of keyword for legal chars */

    ffmbyt(fptr, (fptr->Fptr)->headend, IGNORE_EOF, status); /* move to end */

    ffpbyt(fptr, 80, tcard, status);   /* write the 80 byte card */

    if (*status <= 0)
       (fptr->Fptr)->headend += 80;    /* update end-of-header position */

    return(*status);
}